

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O1

void __thiscall QMT::DES::makekey(DES *this,uint *keyleft,uint *keyright,uint number)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint (*pauVar6) [2];
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  
  uVar2 = *keyleft;
  bVar1 = this->wz_lefttable[number];
  uVar3 = this->wz_leftandtab[(char)bVar1];
  uVar4 = *keyright;
  bVar5 = (long)(char)bVar1 == 1 | 0x1a;
  *keyleft = uVar2 << (bVar1 & 0x1f);
  *keyright = *keyright << (this->wz_lefttable[number] & 0x1fU);
  *keyleft = *keyleft | (uVar3 & uVar2) >> bVar5 & 0xfffffff0;
  *keyright = *keyright | (uVar3 & uVar4) >> bVar5 & 0xfffffff0;
  lVar7 = 0x1ac;
  uVar8 = (ulong)(uint)(0 << (bVar1 & 0x1f));
  do {
    if (uVar8 < 0x18) {
      if ((this->wz_pc2[(long)this->wz_keychoose[uVar8] + -1] & *keyleft) != 0) {
        pcVar9 = this->wz_lefttable + lVar7;
        pauVar6 = this->g_outkey + number;
        goto LAB_001036e5;
      }
    }
    else if ((*(uint *)(this->wz_pc1 + (long)this->wz_keychoose[uVar8] * 4 + -0x10) & *keyright) !=
             0) {
      pcVar9 = this->wz_pc1 + uVar8 * 4;
      pauVar6 = (uint (*) [2])(this->g_outkey[number] + 1);
LAB_001036e5:
      (*pauVar6)[0] = (*pauVar6)[0] | *(uint *)pcVar9;
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    if (uVar8 == 0x30) {
      return;
    }
  } while( true );
}

Assistant:

void DES::makekey(unsigned int *keyleft,unsigned int *keyright ,unsigned int number)
  {
  	unsigned int tmpkey[2] ={0};
  	unsigned int *Ptmpkey = (unsigned int*)tmpkey;
  	unsigned int *Poutkey = (unsigned int*)&g_outkey[number];
  	int j;

  	InitIntArray(tmpkey, 2);

  	*Ptmpkey = *keyleft&wz_leftandtab[wz_lefttable[number]];
  	Ptmpkey[1] = *keyright&wz_leftandtab[wz_lefttable[number]];
  	if (wz_lefttable[number] == 1)
  	{
  		*Ptmpkey >>= 27;
  		Ptmpkey[1] >>= 27;
  	}
  	else
  	{
  		*Ptmpkey >>= 26;
  		Ptmpkey[1] >>= 26;
  	}
  	Ptmpkey[0] &= 0xfffffff0;
  	Ptmpkey[1] &= 0xfffffff0;

  	*keyleft <<= wz_lefttable[number];
  	*keyright <<= wz_lefttable[number];
  	*keyleft |= Ptmpkey[0];
  	*keyright |= Ptmpkey[1];
  	Ptmpkey[0] = 0;
  	//Ptmpkey[1] = 0;

  	for (j = 0; j < 48; j++)
  	{
  		if ( j >= 24 )
  	     {
  	       if ( wz_pc2[wz_keychoose[j] - 28] & *keyright ){
  					Poutkey[1] |= wz_pc2[j - 24];
  				 }

  	     }
  	     else if ( wz_pc2[wz_keychoose[j] - 1] & *keyleft )
  	     {
  	       *Poutkey |= wz_pc2[j];
  	     }
  	}

  }